

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 ExprMakeTree(jx9_gen_state *pGen,jx9_expr_node **apNode,sxi32 nToken)

{
  jx9_expr_node *pjVar1;
  sxi32 sVar2;
  sxi32 sVar3;
  int iVar4;
  bool bVar5;
  int local_58;
  int local_54;
  sxi32 iNest_2;
  sxi32 iNest_1;
  sxi32 iArrTok;
  sxi32 nFuncTok;
  sxi32 iPtr;
  sxi32 iNest;
  sxi32 rc;
  sxi32 iCur;
  jx9_expr_node *pNode;
  sxi32 iRight;
  sxi32 iLeft;
  sxi32 i;
  sxi32 nToken_local;
  jx9_expr_node **apNode_local;
  jx9_gen_state *pGen_local;
  
  if ((nToken < 1) || ((nToken == 1 && ((*apNode)->xCode != (ProcNodeConstruct)0x0)))) {
    return 0;
  }
  for (iNest = 0; sVar3 = iNest, iNest < nToken; iNest = iNest + 1) {
    if ((apNode[iNest] != (jx9_expr_node *)0x0) && (apNode[iNest]->pStart->nType == 0x200)) {
      nFuncTok = 1;
      do {
        while( true ) {
          do {
            iNest = iNest + 1;
            if (nToken <= iNest) goto LAB_0013c62b;
          } while (apNode[iNest] == (jx9_expr_node *)0x0);
          if ((apNode[iNest]->pStart->nType & 0x400) != 0) break;
          if ((apNode[iNest]->pStart->nType & 0x200) != 0) {
            nFuncTok = nFuncTok + 1;
          }
        }
        nFuncTok = nFuncTok + -1;
      } while (0 < nFuncTok);
LAB_0013c62b:
      if ((1 < iNest - sVar3) &&
         (sVar2 = ExprMakeTree(pGen,apNode + (sVar3 + 1),(iNest - sVar3) + -1), sVar2 != 0)) {
        return sVar2;
      }
      ExprFreeTree(pGen,apNode[sVar3]);
      ExprFreeTree(pGen,apNode[iNest]);
      apNode[sVar3] = (jx9_expr_node *)0x0;
      apNode[iNest] = (jx9_expr_node *)0x0;
    }
  }
  pNode._4_4_ = -1;
  for (iNest = 0; iNest < nToken; iNest = iNest + 1) {
    if (apNode[iNest] != (jx9_expr_node *)0x0) {
      pjVar1 = apNode[iNest];
      if (((pjVar1->pOp != (jx9_expr_op *)0x0) && (pjVar1->pOp->iPrec == 2)) &&
         (pjVar1->pLeft == (jx9_expr_node *)0x0)) {
        if (pjVar1->pOp->iOp == 3) {
          iArrTok = 0;
          for (iNest_1 = 0; iNest_1 + iNest < nToken; iNest_1 = iNest_1 + 1) {
            if (apNode[iNest_1 + iNest] != (jx9_expr_node *)0x0) {
              if ((apNode[iNest_1 + iNest]->pStart->nType & 0x200) == 0) {
                if (((apNode[iNest_1 + iNest]->pStart->nType & 0x400) != 0) &&
                   (iArrTok = iArrTok + -1, iArrTok < 1)) break;
              }
              else {
                iArrTok = iArrTok + 1;
              }
            }
          }
          if (nToken <= iNest_1 + iNest) {
            iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,"Missing right parenthesis \')\'"
                                     );
            if (iPtr != -10) {
              iPtr = -0xc;
            }
            return iPtr;
          }
          if (((pNode._4_4_ < 0) || (apNode[pNode._4_4_] == (jx9_expr_node *)0x0)) ||
             ((apNode[pNode._4_4_]->pOp != (jx9_expr_op *)0x0 &&
              (apNode[pNode._4_4_]->pLeft == (jx9_expr_node *)0x0)))) {
            iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,"Invalid function name");
            if (iPtr != -10) {
              iPtr = -0xc;
            }
            return iPtr;
          }
          if ((1 < iNest_1) &&
             (sVar3 = ExprProcessFuncArguments(pGen,pjVar1,apNode + (iNest + 1),iNest_1 + -1),
             sVar3 != 0)) {
            return sVar3;
          }
          pjVar1->pLeft = apNode[pNode._4_4_];
          apNode[pNode._4_4_] = (jx9_expr_node *)0x0;
          for (iArrTok = 1; iArrTok <= iNest_1; iArrTok = iArrTok + 1) {
            apNode[iNest + iArrTok] = (jx9_expr_node *)0x0;
          }
        }
        else {
          pNode._0_4_ = iNest;
          if (pjVar1->pOp->iOp == 2) {
            local_54 = 1;
            if ((-1 < pNode._4_4_) &&
               ((iNest_2 = iNest, apNode[pNode._4_4_]->xCode == jx9CompileVariable ||
                ((apNode[pNode._4_4_]->pOp != (jx9_expr_op *)0x0 &&
                 (apNode[pNode._4_4_]->pOp->iPrec == 2)))))) {
              do {
                while( true ) {
                  do {
                    iNest_2 = iNest_2 + 1;
                    if (nToken <= iNest_2) goto LAB_0013ca37;
                  } while (apNode[iNest_2] == (jx9_expr_node *)0x0);
                  if ((apNode[iNest_2]->pStart->nType & 0x800) == 0) break;
                  local_54 = local_54 + 1;
                }
              } while (((apNode[iNest_2]->pStart->nType & 0x1000) == 0) ||
                      (local_54 = local_54 + -1, 0 < local_54));
LAB_0013ca37:
              if (iNest + 1 < iNest_2) {
                sVar3 = ExprMakeTree(pGen,apNode + (iNest + 1),(iNest_2 - iNest) + -1);
                if (sVar3 != 0) {
                  return sVar3;
                }
                SySetPut(&pjVar1->aNodeArgs,apNode + (iNest + 1));
              }
              pjVar1->pLeft = apNode[pNode._4_4_];
              pjVar1->pRight = (jx9_expr_node *)0x0;
              apNode[pNode._4_4_] = (jx9_expr_node *)0x0;
              local_54 = iNest;
              while (local_54 = local_54 + 1, local_54 <= iNest_2) {
                apNode[local_54] = (jx9_expr_node *)0x0;
              }
            }
          }
          else {
            do {
              pNode._0_4_ = (int)pNode + 1;
              bVar5 = false;
              if ((int)pNode < nToken) {
                bVar5 = apNode[(int)pNode] == (jx9_expr_node *)0x0;
              }
            } while (bVar5);
            if (((((nToken <= (int)pNode) || (pNode._4_4_ < 0)) ||
                 ((apNode[(int)pNode] == (jx9_expr_node *)0x0 ||
                  ((apNode[(int)pNode]->pOp != (jx9_expr_op *)0x0 &&
                   (apNode[(int)pNode]->pLeft == (jx9_expr_node *)0x0)))))) ||
                (apNode[pNode._4_4_] == (jx9_expr_node *)0x0)) ||
               ((apNode[pNode._4_4_]->pOp != (jx9_expr_op *)0x0 &&
                (apNode[pNode._4_4_]->pLeft == (jx9_expr_node *)0x0)))) {
              iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,
                                        "\'%z\': Missing/Invalid member name",pjVar1->pOp);
              if (iPtr != -10) {
                iPtr = -0xc;
              }
              return iPtr;
            }
            pjVar1->pLeft = apNode[pNode._4_4_];
            if ((pjVar1->pLeft->pOp == (jx9_expr_op *)0x0) &&
               (pjVar1->pLeft->xCode != jx9CompileVariable)) {
              iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,
                                        "\'%z\': Expecting a variable as left operand",pjVar1->pOp);
              if (iPtr != -10) {
                iPtr = -0xc;
              }
              return iPtr;
            }
            pjVar1->pRight = apNode[(int)pNode];
            apNode[(int)pNode] = (jx9_expr_node *)0x0;
            apNode[pNode._4_4_] = (jx9_expr_node *)0x0;
          }
        }
      }
      pNode._4_4_ = iNest;
    }
  }
  pNode._4_4_ = -1;
  for (iNest = 0; iNest < nToken; iNest = iNest + 1) {
    if (apNode[iNest] != (jx9_expr_node *)0x0) {
      pjVar1 = apNode[iNest];
      if (((((pjVar1->pOp != (jx9_expr_op *)0x0) && (pjVar1->pOp->iPrec == 3)) &&
           (pjVar1->pLeft == (jx9_expr_node *)0x0)) && (-1 < pNode._4_4_)) &&
         (((apNode[pNode._4_4_]->pOp != (jx9_expr_op *)0x0 && (apNode[pNode._4_4_]->pOp->iPrec == 2)
           ) || (apNode[pNode._4_4_]->xCode == jx9CompileVariable)))) {
        pjVar1->pLeft = apNode[pNode._4_4_];
        apNode[pNode._4_4_] = (jx9_expr_node *)0x0;
      }
      pNode._4_4_ = iNest;
    }
  }
  pNode._4_4_ = -1;
  for (iNest = nToken + -1; -1 < iNest; iNest = iNest + -1) {
    if (apNode[iNest] != (jx9_expr_node *)0x0) {
      pjVar1 = apNode[iNest];
      if (((pjVar1->pOp != (jx9_expr_op *)0x0) && (pjVar1->pOp->iPrec == 3)) &&
         (pjVar1->pLeft == (jx9_expr_node *)0x0)) {
        if (((pNode._4_4_ < 0) ||
            ((apNode[pNode._4_4_]->pOp == (jx9_expr_op *)0x0 &&
             (apNode[pNode._4_4_]->xCode != jx9CompileVariable)))) ||
           ((apNode[pNode._4_4_]->pOp != (jx9_expr_op *)0x0 &&
            (apNode[pNode._4_4_]->pOp->iPrec != 2)))) {
          iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,"\'%z\' operator needs l-value",
                                    pjVar1->pOp);
          if (iPtr != -10) {
            iPtr = -0xc;
          }
          return iPtr;
        }
        pjVar1->pLeft = apNode[pNode._4_4_];
        apNode[pNode._4_4_] = (jx9_expr_node *)0x0;
        pjVar1->iFlags = pjVar1->iFlags | 1;
      }
      pNode._4_4_ = iNest;
    }
  }
  pNode._4_4_ = 0;
  for (iNest = nToken + -1; -1 < iNest; iNest = iNest + -1) {
    if (apNode[iNest] != (jx9_expr_node *)0x0) {
      pjVar1 = apNode[iNest];
      if (((pjVar1->pOp != (jx9_expr_op *)0x0) && (pjVar1->pOp->iPrec == 4)) &&
         (pjVar1->pLeft == (jx9_expr_node *)0x0)) {
        if (pNode._4_4_ < 1) {
          iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,"\'%z\': Missing operand",
                                    pjVar1->pOp);
          if (iPtr != -10) {
            iPtr = -0xc;
          }
          return iPtr;
        }
        pjVar1->pLeft = apNode[pNode._4_4_];
        apNode[pNode._4_4_] = (jx9_expr_node *)0x0;
        if (((pjVar1->pLeft != (jx9_expr_node *)0x0) && (pjVar1->pLeft->pOp != (jx9_expr_op *)0x0))
           && ((4 < pjVar1->pLeft->pOp->iPrec &&
               ((pjVar1->pLeft->pLeft == (jx9_expr_node *)0x0 ||
                (pjVar1->pLeft->pRight == (jx9_expr_node *)0x0)))))) {
          iPtr = jx9GenCompileError(pGen,1,pjVar1->pLeft->pStart->nLine,"\'%z\': Missing operand",
                                    pjVar1->pLeft->pOp);
          if (iPtr != -10) {
            iPtr = -0xc;
          }
          return iPtr;
        }
      }
      pNode._4_4_ = iNest;
    }
  }
  for (iRight = 7; iRight < 0x11; iRight = iRight + 1) {
    pNode._4_4_ = -1;
    for (iNest = 0; iNest < nToken; iNest = iNest + 1) {
      if (apNode[iNest] != (jx9_expr_node *)0x0) {
        pjVar1 = apNode[iNest];
        if (((pjVar1->pOp != (jx9_expr_op *)0x0) && (pjVar1->pOp->iPrec == iRight)) &&
           (pNode._0_4_ = iNest, pjVar1->pLeft == (jx9_expr_node *)0x0)) {
          do {
            pNode._0_4_ = (int)pNode + 1;
            bVar5 = false;
            if ((int)pNode < nToken) {
              bVar5 = apNode[(int)pNode] == (jx9_expr_node *)0x0;
            }
          } while (bVar5);
          if (((((nToken <= (int)pNode) || (pNode._4_4_ < 0)) ||
               ((apNode[(int)pNode] == (jx9_expr_node *)0x0 ||
                ((apNode[(int)pNode]->pOp != (jx9_expr_op *)0x0 &&
                 (apNode[(int)pNode]->pLeft == (jx9_expr_node *)0x0)))))) ||
              (apNode[pNode._4_4_] == (jx9_expr_node *)0x0)) ||
             ((apNode[pNode._4_4_]->pOp != (jx9_expr_op *)0x0 &&
              (apNode[pNode._4_4_]->pLeft == (jx9_expr_node *)0x0)))) {
            iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,"\'%z\': Missing/Invalid operand"
                                      ,pjVar1->pOp);
            if (iPtr != -10) {
              iPtr = -0xc;
            }
            return iPtr;
          }
          pjVar1->pLeft = apNode[pNode._4_4_];
          pjVar1->pRight = apNode[(int)pNode];
          apNode[(int)pNode] = (jx9_expr_node *)0x0;
          apNode[pNode._4_4_] = (jx9_expr_node *)0x0;
        }
        pNode._4_4_ = iNest;
      }
    }
  }
  pNode._4_4_ = -1;
  for (iNest = 0; iNest < nToken; iNest = iNest + 1) {
    if (apNode[iNest] != (jx9_expr_node *)0x0) {
      pjVar1 = apNode[iNest];
      if (((pjVar1->pOp != (jx9_expr_op *)0x0) && (pjVar1->pOp->iOp == 0x26)) &&
         (pjVar1->pLeft == (jx9_expr_node *)0x0)) {
        local_58 = 1;
        if (((pNode._4_4_ < 0) || (apNode[pNode._4_4_] == (jx9_expr_node *)0x0)) ||
           ((sVar3 = iNest, apNode[pNode._4_4_]->pOp != (jx9_expr_op *)0x0 &&
            (apNode[pNode._4_4_]->pLeft == (jx9_expr_node *)0x0)))) {
          iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,"\'%z\': Syntax error",pjVar1->pOp)
          ;
          if (iPtr != -10) {
            iPtr = -0xc;
          }
          return iPtr;
        }
        goto LAB_0013d35c;
      }
      pNode._4_4_ = iNest;
    }
  }
  goto LAB_0013d5ba;
LAB_0013d35c:
  do {
    iVar4 = sVar3;
    pNode._0_4_ = iVar4 + 1;
    if (nToken <= (int)pNode) goto LAB_0013d3fe;
    sVar3 = (int)pNode;
  } while (apNode[(int)pNode] == (jx9_expr_node *)0x0);
  if (((apNode[(int)pNode]->pOp != (jx9_expr_op *)0x0) && (apNode[(int)pNode]->pOp->iOp == 0x26)) &&
     (apNode[(int)pNode]->pCond == (jx9_expr_node *)0x0)) {
    local_58 = local_58 + 1;
    sVar3 = (int)pNode;
    goto LAB_0013d35c;
  }
  sVar3 = (int)pNode;
  if (((apNode[(int)pNode]->pStart->nType & 0x100000) == 0) ||
     (local_58 = local_58 + -1, sVar3 = (int)pNode, 0 < local_58)) goto LAB_0013d35c;
LAB_0013d3fe:
  if ((int)pNode <= iNest + 1) {
    iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,"\'%z\': Missing \'then\' expression",
                              pjVar1->pOp);
    if (iPtr != -10) {
      iPtr = -0xc;
    }
    return iPtr;
  }
  sVar3 = ExprMakeTree(pGen,apNode + (iNest + 1),((int)pNode - iNest) + -1);
  if (sVar3 != 0) {
    return sVar3;
  }
  pjVar1->pLeft = apNode[iNest + 1];
  apNode[iNest + 1] = (jx9_expr_node *)0x0;
  if (nToken <= iVar4 + 2) {
    iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,"\'%z\': Missing \'else\' expression",
                              pjVar1->pOp);
    if (iPtr != -10) {
      iPtr = -0xc;
    }
    return iPtr;
  }
  sVar3 = ExprMakeTree(pGen,apNode + (iVar4 + 2),(nToken - (int)pNode) + -1);
  if (sVar3 != 0) {
    return sVar3;
  }
  pjVar1->pRight = apNode[iVar4 + 2];
  apNode[(int)pNode] = (jx9_expr_node *)0x0;
  apNode[iVar4 + 2] = (jx9_expr_node *)0x0;
  pjVar1->pCond = apNode[pNode._4_4_];
  apNode[pNode._4_4_] = (jx9_expr_node *)0x0;
LAB_0013d5ba:
  pNode._0_4_ = -1;
  iNest = nToken + -1;
  do {
    if (iNest < 0) {
      pNode._4_4_ = -1;
      iNest = 0;
      do {
        if (nToken <= iNest) {
          iNest = 1;
          do {
            if (nToken <= iNest) {
              return 0;
            }
            if (apNode[iNest] != (jx9_expr_node *)0x0) {
              if (((apNode[iNest]->pOp != (jx9_expr_op *)0x0) ||
                  (apNode[iNest]->xCode != (ProcNodeConstruct)0x0)) &&
                 (*apNode != (jx9_expr_node *)0x0)) {
                iPtr = jx9GenCompileError(pGen,1,apNode[iNest]->pStart->nLine,
                                          "Unexpected token \'%z\'",apNode[iNest]->pStart);
                if (iPtr != -10) {
                  iPtr = -0xc;
                }
                return iPtr;
              }
              *apNode = apNode[iNest];
              apNode[iNest] = (jx9_expr_node *)0x0;
            }
            iNest = iNest + 1;
          } while( true );
        }
        if (apNode[iNest] != (jx9_expr_node *)0x0) {
          pjVar1 = apNode[iNest];
          if (((pjVar1->pOp != (jx9_expr_op *)0x0) && (pjVar1->pOp->iPrec == 0x16)) &&
             (pNode._0_4_ = iNest, pjVar1->pLeft == (jx9_expr_node *)0x0)) {
            do {
              pNode._0_4_ = (int)pNode + 1;
              bVar5 = false;
              if ((int)pNode < nToken) {
                bVar5 = apNode[(int)pNode] == (jx9_expr_node *)0x0;
              }
            } while (bVar5);
            if (((((nToken <= (int)pNode) || (pNode._4_4_ < 0)) ||
                 ((apNode[(int)pNode] == (jx9_expr_node *)0x0 ||
                  ((apNode[(int)pNode]->pOp != (jx9_expr_op *)0x0 &&
                   (apNode[(int)pNode]->pLeft == (jx9_expr_node *)0x0)))))) ||
                (apNode[pNode._4_4_] == (jx9_expr_node *)0x0)) ||
               ((apNode[pNode._4_4_]->pOp != (jx9_expr_op *)0x0 &&
                (apNode[pNode._4_4_]->pLeft == (jx9_expr_node *)0x0)))) {
              iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,
                                        "\'%z\': Missing/Invalid operand",pjVar1->pOp);
              if (iPtr != -10) {
                iPtr = -0xc;
              }
              return iPtr;
            }
            pjVar1->pLeft = apNode[pNode._4_4_];
            pjVar1->pRight = apNode[(int)pNode];
            apNode[(int)pNode] = (jx9_expr_node *)0x0;
            apNode[pNode._4_4_] = (jx9_expr_node *)0x0;
          }
          pNode._4_4_ = iNest;
        }
        iNest = iNest + 1;
      } while( true );
    }
    if (apNode[iNest] != (jx9_expr_node *)0x0) {
      pjVar1 = apNode[iNest];
      if (((pjVar1->pOp != (jx9_expr_op *)0x0) && (pjVar1->pOp->iPrec == 0x12)) &&
         (pNode._4_4_ = iNest, pjVar1->pLeft == (jx9_expr_node *)0x0)) {
        do {
          pNode._4_4_ = pNode._4_4_ + -1;
          bVar5 = false;
          if (-1 < pNode._4_4_) {
            bVar5 = apNode[pNode._4_4_] == (jx9_expr_node *)0x0;
          }
        } while (bVar5);
        if ((((pNode._4_4_ < 0) || ((int)pNode < 0)) ||
            ((apNode[(int)pNode] == (jx9_expr_node *)0x0 ||
             ((apNode[(int)pNode]->pOp != (jx9_expr_op *)0x0 &&
              (apNode[(int)pNode]->pLeft == (jx9_expr_node *)0x0)))))) ||
           ((apNode[pNode._4_4_] == (jx9_expr_node *)0x0 ||
            ((apNode[pNode._4_4_]->pOp != (jx9_expr_op *)0x0 &&
             (apNode[pNode._4_4_]->pLeft == (jx9_expr_node *)0x0)))))) {
          iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,"\'%z\': Missing/Invalid operand",
                                    pjVar1->pOp);
          if (iPtr != -10) {
            iPtr = -0xc;
          }
          return iPtr;
        }
        iVar4 = ExprIsModifiableValue(apNode[pNode._4_4_]);
        if ((iVar4 == 0) && (pjVar1->pOp->iVmOp != 0x2a)) {
          iPtr = jx9GenCompileError(pGen,1,pjVar1->pStart->nLine,
                                    "\'%z\': Left operand must be a modifiable l-value",pjVar1->pOp)
          ;
          if (iPtr != -10) {
            iPtr = -0xc;
          }
          return iPtr;
        }
        pjVar1->pLeft = apNode[(int)pNode];
        pjVar1->pRight = apNode[pNode._4_4_];
        apNode[(int)pNode] = (jx9_expr_node *)0x0;
        apNode[pNode._4_4_] = (jx9_expr_node *)0x0;
      }
      pNode._0_4_ = iNest;
    }
    iNest = iNest + -1;
  } while( true );
}

Assistant:

static sxi32 ExprMakeTree(jx9_gen_state *pGen, jx9_expr_node **apNode, sxi32 nToken)
 {
	 sxi32 i, iLeft, iRight;
	 jx9_expr_node *pNode;
	 sxi32 iCur;
	 sxi32 rc;
	 if( nToken <= 0 || (nToken == 1 && apNode[0]->xCode) ){
		 /* TICKET 1433-17: self evaluating node */
		 return SXRET_OK;
	 }
	 /* Process expressions enclosed in parenthesis first */
	 for( iCur =  0 ; iCur < nToken ; ++iCur ){
		 sxi32 iNest;
		 /* Note that, we use strict comparison here '!=' instead of the bitwise and '&' operator
		  * since the LPAREN token can also be an operator [i.e: Function call].
		  */
		 if( apNode[iCur] == 0 || apNode[iCur]->pStart->nType != JX9_TK_LPAREN ){
			 continue;
		 }
		 iNest = 1;
		 iLeft = iCur;
		 /* Find the closing parenthesis */
		 iCur++;
		 while( iCur < nToken ){
			 if( apNode[iCur] ){
				 if( apNode[iCur]->pStart->nType & JX9_TK_RPAREN /* ')' */){
					 /* Decrement nesting level */
					 iNest--;
					 if( iNest <= 0 ){
						 break;
					 }
				 }else if( apNode[iCur]->pStart->nType & JX9_TK_LPAREN /* '(' */ ){
					 /* Increment nesting level */
					 iNest++;
				 }
			 }
			 iCur++;
		 }
		 if( iCur - iLeft > 1 ){
			 /* Recurse and process this expression */
			 rc = ExprMakeTree(&(*pGen), &apNode[iLeft + 1], iCur - iLeft - 1);
			 if( rc != SXRET_OK ){
				 return rc;
			 }
		 }
		 /* Free the left and right nodes */
		 ExprFreeTree(&(*pGen), apNode[iLeft]);
		 ExprFreeTree(&(*pGen), apNode[iCur]);
		 apNode[iLeft] = 0;
		 apNode[iCur] = 0;
	 }
	 /* Handle postfix [i.e: function call, member access] operators with precedence 2 */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 2 && pNode->pLeft == 0  ){
			 if( pNode->pOp->iOp == EXPR_OP_FUNC_CALL ){
				 /* Collect function arguments */
				 sxi32 iPtr = 0;
				 sxi32 nFuncTok = 0;
				 while( nFuncTok + iCur < nToken ){
					 if( apNode[nFuncTok+iCur] ){
						 if( apNode[nFuncTok+iCur]->pStart->nType & JX9_TK_LPAREN /*'('*/ ){
							 iPtr++;
						 }else if ( apNode[nFuncTok+iCur]->pStart->nType & JX9_TK_RPAREN /*')'*/){
							 iPtr--;
							 if( iPtr <= 0 ){
								 break;
							 }
						 }
					 }
					 nFuncTok++;
				 }
				 if( nFuncTok + iCur >= nToken ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "Missing right parenthesis ')'");
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
				 if(  iLeft < 0 || !NODE_ISTERM(iLeft) /*|| ( apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec != 2)*/ ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "Invalid function name");
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 if( nFuncTok > 1 ){
					 /* Process function arguments */
					 rc = ExprProcessFuncArguments(&(*pGen), pNode, &apNode[iCur+1], nFuncTok-1);
					 if( rc != SXRET_OK ){
						 return rc;
					 }
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 apNode[iLeft] = 0;
				 for( iPtr = 1; iPtr <= nFuncTok ; iPtr++ ){
					 apNode[iCur+iPtr] = 0;
				 }
			 }else if (pNode->pOp->iOp == EXPR_OP_SUBSCRIPT ){
				 /* Subscripting */
				 sxi32 iArrTok = iCur + 1;
				 sxi32 iNest = 1;
				 if(  iLeft >= 0 && (apNode[iLeft]->xCode == jx9CompileVariable || (apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec == 2 /* postfix */) ) ){
					 /* Collect index tokens */
				    while( iArrTok < nToken ){
					 if( apNode[iArrTok] ){
						 if( apNode[iArrTok]->pStart->nType & JX9_TK_OSB /*'['*/){
							 /* Increment nesting level */
							 iNest++;
						 }else if( apNode[iArrTok]->pStart->nType & JX9_TK_CSB /*']'*/){
							 /* Decrement nesting level */
							 iNest--;
							 if( iNest <= 0 ){
								 break;
							 }
						 }
					 }
					 ++iArrTok;
				   }
				   if( iArrTok > iCur + 1 ){
					 /* Recurse and process this expression */
					 rc = ExprMakeTree(&(*pGen), &apNode[iCur+1], iArrTok - iCur - 1);
					 if( rc != SXRET_OK ){
						 return rc;
					 }
					 /* Link the node to it's index */
					 SySetPut(&pNode->aNodeArgs, (const void *)&apNode[iCur+1]);
				   }
				   /* Link the node to the tree */
				   pNode->pLeft = apNode[iLeft];
				   pNode->pRight = 0;
				   apNode[iLeft] = 0;
				   for( iNest = iCur + 1 ; iNest <= iArrTok ; ++iNest ){
					 apNode[iNest] = 0;
				  }
				 }
			 }else{
				 /* Member access operators [i.e: '.' ] */
				 iRight = iCur + 1;
				 while( iRight < nToken && apNode[iRight] == 0 ){
					 iRight++;
				 }
				 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid member name", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 if( pNode->pLeft->pOp == 0 && pNode->pLeft->xCode != jx9CompileVariable ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, 
						 "'%z': Expecting a variable as left operand", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 pNode->pRight = apNode[iRight];
				 apNode[iLeft] = apNode[iRight] = 0;
			 }
		 }
		 iLeft = iCur;
	 }
	  /* Handle post/pre icrement/decrement [i.e: ++/--] operators with precedence 3 */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 3 && pNode->pLeft == 0){
			 if( iLeft >= 0 && ((apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec == 2 /* Postfix */)
				 || apNode[iLeft]->xCode == jx9CompileVariable) ){
					 /* Link the node to the tree */
					 pNode->pLeft = apNode[iLeft];
					 apNode[iLeft] = 0; 
			 }
		  }
		 iLeft = iCur;
	  }
	 iLeft = -1;
	 for( iCur = nToken -  1 ; iCur >= 0 ; iCur-- ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 3 && pNode->pLeft == 0){
			 if( iLeft < 0 || (apNode[iLeft]->pOp == 0 && apNode[iLeft]->xCode != jx9CompileVariable)
				 || ( apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec != 2 /* Postfix */) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z' operator needs l-value", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
			 }
			 /* Link the node to the tree */
			 pNode->pLeft = apNode[iLeft];
			 apNode[iLeft] = 0;
			 /* Mark as pre-increment/decrement node */
			 pNode->iFlags |= EXPR_NODE_PRE_INCR;
		  }
		 iLeft = iCur;
	 }
	 /* Handle right associative unary and cast operators [i.e: !, (string), ~...]  with precedence 4 */
	  iLeft = 0;
	  for( iCur = nToken -  1 ; iCur >= 0 ; iCur-- ){
		  if( apNode[iCur] ){
			  pNode = apNode[iCur];
			  if( pNode->pOp && pNode->pOp->iPrec == 4 && pNode->pLeft == 0){
				  if( iLeft > 0 ){
					  /* Link the node to the tree */
					  pNode->pLeft = apNode[iLeft];
					  apNode[iLeft] = 0;
					  if( pNode->pLeft && pNode->pLeft->pOp && pNode->pLeft->pOp->iPrec > 4 ){
						  if( pNode->pLeft->pLeft == 0 || pNode->pLeft->pRight == 0 ){
							   /* Syntax error */
							  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pLeft->pStart->nLine, "'%z': Missing operand", &pNode->pLeft->pOp->sOp);
							  if( rc != SXERR_ABORT ){
								  rc = SXERR_SYNTAX;
							  }
							  return rc;
						  }
					  }
				  }else{
					  /* Syntax error */
					  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing operand", &pNode->pOp->sOp);
					  if( rc != SXERR_ABORT ){
						  rc = SXERR_SYNTAX;
					  }
					  return rc;
				  }
			  }
			  /* Save terminal position */
			  iLeft = iCur;
		  }
	  }	 
	 /* Process left and non-associative binary operators [i.e: *, /, &&, ||...]*/
	 for( i = 7 ; i < 17 ; i++ ){
		 iLeft = -1;
		 for( iCur = 0 ; iCur < nToken ; ++iCur ){
			 if( apNode[iCur] == 0 ){
				 continue;
			 }
			 pNode = apNode[iCur];
			 if( pNode->pOp && pNode->pOp->iPrec == i && pNode->pLeft == 0 ){
				 /* Get the right node */
				 iRight = iCur + 1;
				 while( iRight < nToken && apNode[iRight] == 0 ){
					 iRight++;
				 }
				 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 pNode->pRight = apNode[iRight];
				 apNode[iLeft] = apNode[iRight] = 0;
			 }
			 iLeft = iCur;
		 }
	 }
	 /* Handle the ternary operator. (expr1) ? (expr2) : (expr3) 
	  * Note that we do not need a precedence loop here since
	  * we are dealing with a single operator.
	  */
	  iLeft = -1;
	  for( iCur = 0 ; iCur < nToken ; ++iCur ){
		  if( apNode[iCur] == 0 ){
			  continue;
		  }
		  pNode = apNode[iCur];
		  if( pNode->pOp && pNode->pOp->iOp == EXPR_OP_QUESTY && pNode->pLeft == 0 ){
			  sxi32 iNest = 1;
			  if( iLeft < 0 || !NODE_ISTERM(iLeft) ){
				  /* Missing condition */
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Syntax error", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					  rc = SXERR_SYNTAX;
				  }
				  return rc;
			  }
			  /* Get the right node */
			  iRight = iCur + 1;
			  while( iRight < nToken  ){
				  if( apNode[iRight] ){
					  if( apNode[iRight]->pOp && apNode[iRight]->pOp->iOp == EXPR_OP_QUESTY && apNode[iRight]->pCond == 0){
						  /* Increment nesting level */
						  ++iNest;
					  }else if( apNode[iRight]->pStart->nType & JX9_TK_COLON /*:*/ ){
						  /* Decrement nesting level */
						  --iNest;
						  if( iNest <= 0 ){
							  break;
						  }
					  }
				  }
				  iRight++;
			  }
			  if( iRight > iCur + 1 ){
				  /* Recurse and process the then expression */
				  rc = ExprMakeTree(&(*pGen), &apNode[iCur + 1], iRight - iCur - 1);
				  if( rc != SXRET_OK ){
					  return rc;
				  }
				  /* Link the node to the tree */
				  pNode->pLeft = apNode[iCur + 1];
			  }else{
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing 'then' expression", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			  }
			  apNode[iCur + 1] = 0;
			  if( iRight + 1 < nToken ){
				  /* Recurse and process the else expression */
				  rc = ExprMakeTree(&(*pGen), &apNode[iRight + 1], nToken - iRight - 1);
				  if( rc != SXRET_OK ){
					  return rc;
				  }
				  /* Link the node to the tree */
				  pNode->pRight = apNode[iRight + 1];
				  apNode[iRight + 1] =  apNode[iRight] = 0;
			  }else{
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing 'else' expression", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			  }
			  /* Point to the condition */
			  pNode->pCond  = apNode[iLeft];
			  apNode[iLeft] = 0;
			  break;
		  }
		  iLeft = iCur;
	  }
	 /* Process right associative binary operators [i.e: '=', '+=', '/='] 
	  * Note: All right associative binary operators have precedence 18
	  * so there is no need for a precedence loop here.
	  */
	 iRight = -1;
	 for( iCur = nToken -  1 ; iCur >= 0 ; iCur--){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 18 && pNode->pLeft == 0 ){
			 /* Get the left node */
			 iLeft = iCur - 1;
			 while( iLeft >= 0 && apNode[iLeft] == 0 ){
				 iLeft--;
			 }
			 if( iLeft < 0 || iRight < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
				 /* Syntax error */
				 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
				 if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			 }
			 if( ExprIsModifiableValue(apNode[iLeft]) == FALSE ){
				 if( pNode->pOp->iVmOp != JX9_OP_STORE  ){
					 /* Left operand must be a modifiable l-value */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, 
						 "'%z': Left operand must be a modifiable l-value", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
			 }
			 /* Link the node to the tree (Reverse) */
			 pNode->pLeft = apNode[iRight];
			 pNode->pRight = apNode[iLeft];
			 apNode[iLeft] = apNode[iRight] = 0;
		 }
		 iRight = iCur;
	 }
	 /* Process the lowest precedence operator (22, comma) */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 22 /* ',' */ && pNode->pLeft == 0 ){
			 /* Get the right node */
			 iRight = iCur + 1;
			 while( iRight < nToken && apNode[iRight] == 0 ){
				 iRight++;
			 }
			 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
				 /* Syntax error */
				 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
				 if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			 }
			 /* Link the node to the tree */
			 pNode->pLeft = apNode[iLeft];
			 pNode->pRight = apNode[iRight];
			 apNode[iLeft] = apNode[iRight] = 0;
		 }
		 iLeft = iCur;
	 }
	 /* Point to the root of the expression tree */
	 for( iCur = 1 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] ){
			 if( (apNode[iCur]->pOp || apNode[iCur]->xCode ) && apNode[0] != 0){
				 rc = jx9GenCompileError(pGen, E_ERROR, apNode[iCur]->pStart->nLine, "Unexpected token '%z'", &apNode[iCur]->pStart->sData);
				  if( rc != SXERR_ABORT ){
					  rc = SXERR_SYNTAX;
				  }
				  return rc;  
			 }
			 apNode[0] = apNode[iCur];
			 apNode[iCur] = 0;
		 }
	 }
	 return SXRET_OK;
 }